

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

optional<KVEntryUnknown> * __thiscall
ktx::KVEntry::
load<ktx::CommandCompare::compareKVEntry(ktx::PrintDiff&,std::basic_string_view<char,std::char_traits<char>>const&,ktxKVListEntry*,ktxKVListEntry*)::KVEntryUnknown>
          (optional<KVEntryUnknown> *__return_storage_ptr__,KVEntry *this,ktxHashListEntry *entry)

{
  KVEntryUnknown newEntry;
  char *local_28;
  undefined4 local_20 [2];
  
  if ((this != (KVEntry *)0x0) &&
     (ktxHashListEntry_GetValue(this,local_20,&local_28), local_28 != (char *)0x0)) {
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<KVEntryUnknown,_false,_false>)._M_payload
             .super__Optional_payload<KVEntryUnknown,_true,_false,_false>.
             super__Optional_payload_base<KVEntryUnknown>._M_payload + 0x10) = local_20[0];
    (__return_storage_ptr__->super__Optional_base<KVEntryUnknown,_false,_false>)._M_payload.
    super__Optional_payload<KVEntryUnknown,_true,_false,_false>.
    super__Optional_payload_base<KVEntryUnknown>._M_payload._M_value.super_KVEntry.value = local_28;
    (__return_storage_ptr__->super__Optional_base<KVEntryUnknown,_false,_false>)._M_payload.
    super__Optional_payload<KVEntryUnknown,_true,_false,_false>.
    super__Optional_payload_base<KVEntryUnknown>._M_payload._M_value.super_KVEntry._vptr_KVEntry =
         (_func_int **)&PTR__KVEntry_00240a20;
    (__return_storage_ptr__->super__Optional_base<KVEntryUnknown,_false,_false>)._M_payload.
    super__Optional_payload<KVEntryUnknown,_true,_false,_false>.
    super__Optional_payload_base<KVEntryUnknown>._M_engaged = true;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super__Optional_base<KVEntryUnknown,_false,_false>)._M_payload.
  super__Optional_payload<KVEntryUnknown,_true,_false,_false>.
  super__Optional_payload_base<KVEntryUnknown>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

static std::optional<T> load(ktxHashListEntry* entry) {
        if (entry) {
            T newEntry;
            ktxHashListEntry_GetValue(entry, &newEntry.valueLen, reinterpret_cast<void**>(&newEntry.value));
            if (newEntry.value)
                return std::optional<T>(std::move(newEntry));
        }
        return std::optional<T>();
    }